

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  uint64_t uVar1;
  TValue *pTVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *mn;
  Node *nn;
  Node *freenode;
  Node *collide;
  Node *nodebase;
  Node *n;
  cTValue *key_local;
  GCtab *t_local;
  lua_State *L_local;
  GCobj *o;
  
  nodebase = hashkey(t,key);
  if (((nodebase->val).u64 != 0xffffffffffffffff) || (t->hmask == 0)) {
    pTVar2 = (TValue *)(t->freetop).ptr64;
    do {
      nn = (Node *)&pTVar2->gcr;
      if (nn == (Node *)(t->node).ptr64) {
        rehashtab(L,t,key);
        pTVar2 = lj_tab_set(L,t,key);
        return pTVar2;
      }
      pTVar2 = &nn[-1].val;
    } while (nn[-1].key.u64 != 0xffffffffffffffff);
    (t->freetop).ptr64 = (uint64_t)pTVar2;
    freenode = hashkey(t,&nodebase->key);
    if (freenode == nodebase) {
      nn[-1].next.ptr64 = (nodebase->next).ptr64;
      (nodebase->next).ptr64 = (uint64_t)pTVar2;
      nodebase = (Node *)pTVar2;
    }
    else {
      for (; (Node *)(freenode->next).ptr64 != nodebase; freenode = (Node *)(freenode->next).ptr64)
      {
      }
      (freenode->next).ptr64 = (uint64_t)pTVar2;
      *pTVar2 = nodebase->val;
      nn[-1].key = nodebase->key;
      nn[-1].next.ptr64 = (nodebase->next).ptr64;
      (nodebase->next).ptr64 = 0;
      (nodebase->val).u64 = 0xffffffffffffffff;
      do {
        nn = (Node *)&pTVar2->gcr;
        if ((nn->next).ptr64 == 0) goto LAB_0014af5b;
        pTVar2 = (TValue *)(nn->next).ptr64;
      } while ((((TValue *)&(pTVar2->gcr).gcptr64)->u64 == 0xffffffffffffffff) ||
              (pNVar3 = hashkey(t,&((Node *)pTVar2)->key), pNVar3 != nodebase));
      (nn->next).ptr64 = (((Node *)pTVar2)->next).ptr64;
      (((Node *)pTVar2)->next).ptr64 = (nodebase->next).ptr64;
      (nodebase->next).ptr64 = (uint64_t)pTVar2;
      pNVar3 = nn;
      while (nn = pNVar3, pNVar3 = (Node *)(nn->next).ptr64, pNVar3 != (Node *)0x0) {
        if ((((pNVar3->val).u64 != 0xffffffffffffffff) &&
            (pNVar4 = hashkey(t,&pNVar3->key), pNVar4 != nn)) && (pNVar4 != pNVar3)) {
          (nn->next).ptr64 = (pNVar3->next).ptr64;
          (pNVar3->next).ptr64 = (pNVar4->next).ptr64;
          (pNVar4->next).ptr64 = (uint64_t)pNVar3;
          pNVar3 = nn;
        }
      }
    }
  }
LAB_0014af5b:
  nodebase->key = *key;
  if ((nodebase->key).u64 == 0x8000000000000000) {
    (nodebase->key).u64 = 0;
  }
  if ((t->marked & 4) != 0) {
    uVar1 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
    *(GCtab **)(uVar1 + 0x40) = t;
  }
  return &nodebase->val;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = getfreetop(t, nodebase);
    lj_assertL(freenode >= nodebase && freenode <= nodebase+t->hmask+1,
	       "bad freenode");
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setfreetop(t, nodebase, freenode);
    lj_assertL(freenode != &G(L)->nilnode, "store to fallback hash");
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /* Rechain pseudo-resurrected string keys with colliding hashes. */
      while (nextnode(freenode)) {
	Node *nn = nextnode(freenode);
	if (!tvisnil(&nn->val) && hashkey(t, &nn->key) == n) {
	  freenode->next = nn->next;
	  nn->next = n->next;
	  setmref(n->next, nn);
	  /*
	  ** Rechaining a resurrected string key creates a new dilemma:
	  ** Another string key may have originally been resurrected via
	  ** _any_ of the previous nodes as a chain anchor. Including
	  ** a node that had to be moved, which makes them unreachable.
	  ** It's not feasible to check for all previous nodes, so rechain
	  ** any string key that's currently in a non-main positions.
	  */
	  while ((nn = nextnode(freenode))) {
	    if (!tvisnil(&nn->val)) {
	      Node *mn = hashkey(t, &nn->key);
	      if (mn != freenode && mn != nn) {
		freenode->next = nn->next;
		nn->next = mn->next;
		setmref(mn->next, nn);
	      } else {
		freenode = nn;
	      }
	    } else {
	      freenode = nn;
	    }
	  }
	  break;
	} else {
	  freenode = nn;
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lj_assertL(tvisnil(&n->val), "new hash slot is not empty");
  return &n->val;
}